

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void __thiscall ArgTest_VisitInvalidArg_Test::TestBody(ArgTest_VisitInvalidArg_Test *this)

{
  MockSpec<test_result_(fmt::v5::monostate)> *this_00;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  StrictMock<mock_visitor<fmt::v5::monostate>_> visitor;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_f8;
  undefined4 local_e8;
  StrictMock<mock_visitor<fmt::v5::monostate>_> local_d0;
  
  testing::StrictMock<mock_visitor<fmt::v5::monostate>_>::StrictMock(&local_d0);
  testing::A<fmt::v5::monostate>();
  this_00 = mock_visitor<fmt::v5::monostate>::gmock_visit
                      (&local_d0.super_mock_visitor<fmt::v5::monostate>,
                       (Matcher<fmt::v5::monostate> *)&local_f8.string);
  testing::internal::MockSpec<test_result_(fmt::v5::monostate)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x196,"visitor","visit(_)");
  testing::internal::MatcherBase<fmt::v5::monostate>::~MatcherBase
            ((MatcherBase<fmt::v5::monostate> *)&local_f8.string);
  local_f8.int_value = 0;
  local_e8 = 0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<fmt::v5::monostate>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_d0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_f8.string);
  testing::StrictMock<mock_visitor<fmt::v5::monostate>_>::~StrictMock(&local_d0);
  return;
}

Assistant:

TEST(ArgTest, VisitInvalidArg) {
  testing::StrictMock< mock_visitor<fmt::monostate> > visitor;
  EXPECT_CALL(visitor, visit(_));
  fmt::basic_format_arg<fmt::format_context> arg;
  visit(visitor, arg);
}